

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawWindow
          (DateTimePickerPrivate *this,QPainter *p,QStyleOption *opt)

{
  int iVar1;
  int iVar2;
  QPalette *this_00;
  QColor *pQVar3;
  int h;
  int y1;
  QColor QVar4;
  QBrush local_180 [8];
  undefined6 local_178;
  undefined2 uStack_172;
  undefined1 local_170 [8];
  undefined6 local_168;
  undefined2 uStack_162;
  QColor c5;
  QColor local_148;
  QColor c4;
  QColor local_128;
  QColor c3;
  QPointF local_100;
  QPointF local_f0;
  QLinearGradient local_e0 [8];
  QLinearGradient g;
  undefined6 local_78;
  undefined2 uStack_72;
  QColor c2;
  QColor c1;
  QColor baseColor;
  int yBottom;
  int yTop;
  int alpha2;
  int alpha;
  int windowMiddleHeight;
  int windowHeight;
  int windowOffset;
  QStyleOption *opt_local;
  QPainter *p_local;
  DateTimePickerPrivate *this_local;
  
  iVar2 = this->itemHeight;
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  h = (this->itemHeight + (iVar2 >> 2) * 2) / 2;
  y1 = this->currentItemY - (iVar2 >> 2);
  iVar2 = y1 + h * 2;
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,Dark);
  c2._8_8_ = *(undefined8 *)pQVar3;
  c1._0_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
  c1._8_8_ = c2._8_8_;
  QColor::setAlpha((int)&c2 + 8);
  QPainter::setPen((QColor *)p);
  iVar1 = QRect::width((QRect *)(opt + 0x10));
  QPainter::drawLine(p,0,y1,iVar1,y1);
  iVar1 = QRect::width((QRect *)(opt + 0x10));
  QPainter::drawLine(p,0,iVar2,iVar1,iVar2);
  QVar4 = lighterColor((QColor *)((long)&c1.ct + 4),0x6e);
  c2._0_6_ = QVar4.ct._4_6_;
  local_78 = QVar4._0_6_;
  uStack_72 = QVar4.ct._2_2_;
  QColor::setAlpha((int)&local_78);
  QPainter::setPen((QColor *)p);
  iVar2 = QRect::width((QRect *)(opt + 0x10));
  QPainter::drawLine(p,0,y1 + 1,iVar2,y1 + 2);
  QPointF::QPointF(&local_f0,0.0,0.0);
  QPointF::QPointF(&local_100,0.0,1.0);
  QLinearGradient::QLinearGradient(local_e0,(QPointF *)&local_f0,(QPointF *)&local_100);
  QGradient::setCoordinateMode((CoordinateMode)local_e0);
  QVar4 = lighterColor((QColor *)((long)&c1.ct + 4),0x5f);
  c4.ct._4_6_ = QVar4._0_6_;
  c4._14_2_ = QVar4.ct._2_2_;
  local_128._0_6_ = QVar4.ct._4_6_;
  c3._0_6_ = local_128._0_6_;
  local_128.ct._4_6_ = c4.ct._4_6_;
  local_128._14_2_ = c4._14_2_;
  QColor::setAlpha((int)&local_128 + 8);
  QGradient::setColorAt(0.0,(QColor *)local_e0);
  QVar4 = lighterColor((QColor *)((long)&c1.ct + 4),0x32);
  local_148._0_6_ = QVar4.ct._4_6_;
  c4._0_6_ = local_148._0_6_;
  local_148.ct._4_6_ = QVar4._0_6_;
  local_148._14_2_ = QVar4.ct._2_2_;
  QColor::setAlpha((int)&local_148 + 8);
  QGradient::setColorAt(1.0,(QColor *)local_e0);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)((long)&c5.ct + 4),(QGradient *)local_e0);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)((long)&c5.ct + 4));
  iVar2 = QRect::width((QRect *)(opt + 0x10));
  QPainter::drawRect(p,0,y1 + 2,iVar2,h + -2);
  QVar4 = lighterColor((QColor *)((long)&c1.ct + 4),0x23);
  local_178 = QVar4._0_6_;
  uStack_172 = QVar4.ct._2_2_;
  local_170._0_6_ = QVar4.ct._4_6_;
  local_170._6_2_ = QVar4._14_2_;
  c5._0_6_ = local_170._0_6_;
  local_168 = local_178;
  uStack_162 = uStack_172;
  QColor::setAlpha((int)&local_168);
  QBrush::QBrush(local_180,(QColor *)&local_168,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_180);
  iVar2 = QRect::width((QRect *)(opt + 0x10));
  QPainter::drawRect(p,0,y1 + h,iVar2,h);
  QLinearGradient::~QLinearGradient(local_e0);
  return;
}

Assistant:

void
DateTimePickerPrivate::drawWindow( QPainter * p, const QStyleOption & opt )
{
	const int windowOffset = itemHeight / 4;
	const int windowHeight = itemHeight + windowOffset * 2;
	const int windowMiddleHeight = windowHeight / 2;

	const int alpha = 150;
	const int alpha2 = 255;

	int yTop = currentItemY - windowOffset;
	int yBottom = yTop + windowMiddleHeight * 2;

	const QColor baseColor = q->palette().color( QPalette::Dark );

	QColor c1 = baseColor;
	c1.setAlpha( alpha2 );
	p->setPen( c1 );

	p->drawLine( 0, yTop, opt.rect.width(), yTop );
	p->drawLine( 0, yBottom, opt.rect.width(), yBottom );

	QColor c2 = lighterColor( baseColor, 110 );
	c2.setAlpha( alpha2 );
	p->setPen( c2 );

	p->drawLine( 0, yTop + 1, opt.rect.width(), yTop + 2 );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );

	QColor c3 = lighterColor( baseColor, 95 );
	c3.setAlpha( alpha );
	g.setColorAt( 0.0, c3 );

	QColor c4 = lighterColor( baseColor, 50 );
	c4.setAlpha( alpha );
	g.setColorAt( 1.0, c4 );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRect( 0, yTop + 2, opt.rect.width(), windowMiddleHeight - 2 );

	QColor c5 = lighterColor( baseColor, 35 );
	c5.setAlpha( alpha );
	p->setBrush( c5 );
	p->drawRect( 0, yTop + windowMiddleHeight,
		opt.rect.width(), windowMiddleHeight );
}